

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trend_suite.cpp
# Opt level: O0

void double_suite::test_scatter(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  double absolute_tolerance;
  double *in_stack_fffffffffffffee8;
  double local_108;
  value_type local_100;
  size_type local_f8;
  double local_e8;
  value_type local_e0;
  size_type local_d8;
  double local_c8;
  value_type local_c0;
  size_type local_b8;
  double local_a8;
  value_type local_a0;
  size_type local_98;
  double local_88;
  value_type local_80;
  size_type local_78;
  double local_68;
  value_type local_60;
  size_type local_58;
  double local_48;
  value_type local_40;
  undefined1 local_38 [8];
  trend<double> filter;
  close_to<double> tolerance;
  
  absolute_tolerance = std::numeric_limits<double>::min();
  trial::online::detail::close_to<double>::close_to
            ((close_to<double> *)&filter.grand.member.count,1e-05,absolute_tolerance);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::basic_trend
            ((basic_trend<double,_(trial::online::with)1> *)local_38);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,1.0);
  local_40 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                       ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_48 = 1.0;
  local_58 = filter.grand.member.count;
  predicate_05.absolute = tolerance.relative;
  predicate_05.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xd7,0x1064e2,(char *)&local_40,&local_48,in_stack_fffffffffffffee8,
             predicate_05);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,2.0);
  local_60 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                       ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_68 = 2.0;
  local_78 = filter.grand.member.count;
  predicate_04.absolute = tolerance.relative;
  predicate_04.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","2.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xd9,0x1064e2,(char *)&local_60,&local_68,in_stack_fffffffffffffee8,
             predicate_04);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,1.3);
  local_80 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                       ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_88 = 1.67778;
  local_98 = filter.grand.member.count;
  predicate_03.absolute = tolerance.relative;
  predicate_03.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.67778","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xdb,0x1064e2,(char *)&local_80,&local_88,in_stack_fffffffffffffee8,
             predicate_03);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,3.75);
  local_a0 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                       ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_a8 = 3.06458;
  local_b8 = filter.grand.member.count;
  predicate_02.absolute = tolerance.relative;
  predicate_02.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","3.06458","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xdd,0x1064e2,(char *)&local_a0,&local_a8,in_stack_fffffffffffffee8,
             predicate_02);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,2.25);
  local_c0 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                       ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_c8 = 2.97767;
  local_d8 = filter.grand.member.count;
  predicate_01.absolute = tolerance.relative;
  predicate_01.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","2.97767","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xdf,0x1064e2,(char *)&local_c0,&local_c8,in_stack_fffffffffffffee8,
             predicate_01);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,1.4);
  local_e0 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                       ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_e8 = 2.53139;
  local_f8 = filter.grand.member.count;
  predicate_00.absolute = tolerance.relative;
  predicate_00.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","2.53139","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xe1,0x1064e2,(char *)&local_e0,&local_e8,in_stack_fffffffffffffee8,
             predicate_00);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,4.1);
  local_100 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                        ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_108 = 3.28201;
  predicate.absolute = tolerance.relative;
  predicate.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","3.28201","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xe3,0x1064e2,(char *)&local_100,&local_108,
             (double *)filter.grand.member.count,predicate);
  return;
}

Assistant:

void test_scatter()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    cumulative::trend<double> filter;

    filter.push(1.0);
    TRIAL_TEST_WITH(filter.value(), 1.0, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.value(), 2.0, tolerance);
    filter.push(1.3);
    TRIAL_TEST_WITH(filter.value(), 1.67778, tolerance);
    filter.push(3.75);
    TRIAL_TEST_WITH(filter.value(), 3.06458, tolerance);
    filter.push(2.25);
    TRIAL_TEST_WITH(filter.value(), 2.97767, tolerance);
    filter.push(1.4);
    TRIAL_TEST_WITH(filter.value(), 2.53139, tolerance);
    filter.push(4.1);
    TRIAL_TEST_WITH(filter.value(), 3.28201, tolerance);
}